

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O2

void Ivy_TableProfile(Ivy_Man_t *p)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  iVar1 = 0;
  for (lVar2 = 0; lVar2 < p->nTableSize; lVar2 = lVar2 + 1) {
    if (p->pTable[lVar2] == 0) {
      bVar3 = iVar1 != 0;
      iVar1 = 0;
      if (bVar3) {
        iVar1 = 0;
        printf("%d ");
      }
    }
    else {
      iVar1 = iVar1 + 1;
    }
  }
  return;
}

Assistant:

void Ivy_TableProfile( Ivy_Man_t * p )
{
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        if ( p->pTable[i] )
            Counter++;
        else if ( Counter )
        {
            printf( "%d ", Counter );
            Counter = 0;
        }
    }
}